

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_cb_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  
  fs_event_cb_called = fs_event_cb_called + 1;
  if (handle == &fs_event) {
    if (status != 0) goto LAB_00150c2f;
    if (events != 2) goto LAB_00150c34;
    iVar1 = strcmp(filename,"file2");
    handle = (uv_fs_event_t *)filename;
    if (iVar1 == 0) {
      handle = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close(&fs_event,close_cb);
        return;
      }
      goto LAB_00150c3e;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00150c2f:
    fs_event_cb_file_cold_2();
LAB_00150c34:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00150c3e:
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    uv_close(handle,close_cb);
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return;
}

Assistant:

static void fs_event_cb_file(uv_fs_event_t* handle, const char* filename,
  int events, int status) {
  ++fs_event_cb_called;
  ASSERT(handle == &fs_event);
  ASSERT(status == 0);
  ASSERT(events == UV_CHANGE);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT(strcmp(filename, "file2") == 0);
  #else
  ASSERT(filename == NULL || strcmp(filename, "file2") == 0);
  #endif
  ASSERT(0 == uv_fs_event_stop(handle));
  uv_close((uv_handle_t*)handle, close_cb);
}